

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

int AF__PlayerInfo_SetLogText
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  player_t *this;
  char *in_RAX;
  char *pcVar1;
  FString log;
  FString local_18;
  
  if (numparam < 1) {
    pcVar1 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      if (numparam == 1) {
        pcVar1 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x02') {
          this = (player_t *)(param->field_0).field_1.a;
          local_18.Chars = in_RAX;
          FString::AttachToOther(&local_18,(FString *)(param + 1));
          player_t::SetLogText(this,local_18.Chars);
          FString::~FString(&local_18);
          return 0;
        }
        pcVar1 = "param[paramnum].Type == REGT_STRING";
      }
      __assert_fail(pcVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                    ,0x203,
                    "int AF__PlayerInfo_SetLogText(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar1 = "param[paramnum].Type == REGT_POINTER";
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x202,
                "int AF__PlayerInfo_SetLogText(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(_PlayerInfo, SetLogText)
{
	PARAM_SELF_STRUCT_PROLOGUE(player_t);
	PARAM_STRING(log);
	self->SetLogText(log);
	return 0;
}